

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u32 sqlite3TriggerColmask
              (Parse *pParse,Trigger *pTrigger,ExprList *pChanges,int isNew,int tr_tm,Table *pTab,
              int orconf)

{
  u32 uVar1;
  int iVar2;
  TriggerPrg *pTVar3;
  u32 uVar4;
  
  uVar4 = 0xffffffff;
  if (pTab->eTabType != '\x02') {
    if (pTrigger == (Trigger *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar1 = uVar4;
        if ((((0x82 - (pChanges == (ExprList *)0x0) == (uint)pTrigger->op) &&
             (((uint)pTrigger->tr_tm & tr_tm) != 0)) &&
            (iVar2 = checkColumnOverlap(pTrigger->pColumns,pChanges), iVar2 != 0)) &&
           ((uVar1 = 0xffffffff, pTrigger->bReturning == '\0' &&
            (pTVar3 = getRowTrigger(pParse,pTrigger,pTab,orconf), uVar1 = uVar4,
            pTVar3 != (TriggerPrg *)0x0)))) {
          uVar1 = uVar4 | pTVar3->aColmask[(uint)isNew];
        }
        uVar4 = uVar1;
        pTrigger = pTrigger->pNext;
      } while (pTrigger != (Trigger *)0x0);
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3TriggerColmask(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int isNew,           /* 1 for new.* ref mask, 0 for old.* ref mask */
  int tr_tm,           /* Mask of TRIGGER_BEFORE|TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int orconf           /* Default ON CONFLICT policy for trigger steps */
){
  const int op = pChanges ? TK_UPDATE : TK_DELETE;
  u32 mask = 0;
  Trigger *p;

  assert( isNew==1 || isNew==0 );
  if( IsView(pTab) ){
    return 0xffffffff;
  }
  for(p=pTrigger; p; p=p->pNext){
    if( p->op==op
     && (tr_tm&p->tr_tm)
     && checkColumnOverlap(p->pColumns,pChanges)
    ){
      if( p->bReturning ){
        mask = 0xffffffff;
      }else{
        TriggerPrg *pPrg;
        pPrg = getRowTrigger(pParse, p, pTab, orconf);
        if( pPrg ){
          mask |= pPrg->aColmask[isNew];
        }
      }
    }
  }

  return mask;
}